

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O1

void duckdb::ParsePathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  ulong uVar8;
  idx_t split_size;
  TemplatedValidityData<unsigned_long> *pTVar9;
  string_t *extraout_RDX;
  char *input_data_00;
  idx_t list_idx;
  uint *puVar10;
  idx_t size;
  idx_t idx_in_entry;
  ulong uVar11;
  idx_t input_size;
  SplitInput split_input;
  string input_sep;
  string sep;
  UnifiedVectorFormat input_data;
  undefined1 local_148 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  char *local_118;
  unsigned_long *local_110;
  string_t *local_108;
  unsigned_long local_100 [2];
  buffer_ptr<ValidityBuffer> *local_f0;
  DataChunk *local_e8;
  Vector *local_e0;
  data_ptr_t local_d8;
  Vector *local_d0;
  data_ptr_t local_c8;
  undefined1 local_c0 [16];
  SelectionVector local_b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar7,args->count,&local_78);
  local_c8 = local_78.data;
  local_110 = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"default","");
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0xd0) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
    Vector::ToUnifiedFormat(pvVar7,args->count,(UnifiedVectorFormat *)local_c0);
    if (((unsigned_long *)local_b0[0].sel_vector == (unsigned_long *)0x0) ||
       ((*local_b0[0].sel_vector & 1) != 0)) {
      if ((ulong)*(uint *)local_c0._8_8_ < 0xd) {
        puVar10 = (uint *)(local_c0._8_8_ + 4);
      }
      else {
        puVar10 = *(uint **)(local_c0._8_8_ + 8);
      }
      local_148._0_8_ = (Vector *)(local_148 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,puVar10,(ulong)*(uint *)local_c0._8_8_ + (long)puVar10);
      ::std::__cxx11::string::operator=((string *)&local_110,(string *)local_148);
      if ((Vector *)local_148._0_8_ != (Vector *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_);
      }
    }
    if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    }
    if (local_b0[0].selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0[0].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  local_148._0_4_ = SUB84(local_108,0);
  if ((uint)local_148._0_4_ < 0xd) {
    local_148._12_4_ = 0;
    local_148._4_4_ = 0;
    local_148._8_4_ = 0;
    if (local_148._0_4_ != 0) {
      switchD_015ff80e::default(local_148 + 4,local_110,(ulong)(local_148._0_4_ & 0xf));
      local_108 = extraout_RDX;
    }
  }
  else {
    local_148._4_4_ = (undefined4)*local_110;
    local_148._8_4_ = SUB84(local_110,0);
    local_148._12_4_ = (undefined4)((ulong)local_110 >> 0x20);
  }
  GetSeparator_abi_cxx11_((string *)local_c0,(duckdb *)local_148,local_108);
  Vector::SetVectorType(result,FLAT_VECTOR);
  ListVector::SetListSize(result,0);
  local_d8 = result->data;
  local_d0 = ListVector::GetEntry(result);
  FlatVector::VerifyFlatVector(result);
  if (args->count == 0) {
    size = 0;
  }
  else {
    local_f0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    size = 0;
    uVar11 = 0;
    local_e8 = args;
    local_e0 = result;
    do {
      uVar8 = uVar11;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)(local_78.sel)->sel_vector[uVar11];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) != 0)) {
        local_148._0_4_ = SUB84(result,0);
        local_148._4_4_ = (undefined4)((ulong)result >> 0x20);
        local_148._8_4_ = SUB84(local_d0,0);
        local_148._12_4_ = (undefined4)((ulong)local_d0 >> 0x20);
        local_120._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c8 + uVar8 * 0x10);
        local_118 = *(char **)(local_c8 + uVar8 * 0x10 + 8);
        input_size = (ulong)local_120._M_pi & 0xffffffff;
        local_148._16_8_ = size;
        if (input_size == 0) {
          list_idx = 0;
        }
        else {
          input_data_00 = local_118;
          if ((uint)local_120._M_pi < 0xd) {
            input_data_00 = (char *)((long)&local_120._M_pi + 4);
          }
          list_idx = 0;
          do {
            if (input_size == 0) goto LAB_01b39497;
            split_size = Find(input_data_00,input_size,(string *)local_c0);
            iVar6 = 3;
            if (split_size != 0xffffffffffffffff && split_size <= input_size) {
              if (split_size == 0) {
                if (list_idx == 0) {
                  SplitInput::AddSplit((SplitInput *)local_148,input_data_00,1,0);
                  list_idx = 1;
                  iVar6 = 1;
                  if (input_size == 1) goto LAB_01b39486;
                }
              }
              else {
                SplitInput::AddSplit((SplitInput *)local_148,input_data_00,split_size,list_idx);
                list_idx = list_idx + 1;
              }
              input_data_00 = input_data_00 + split_size + 1;
              input_size = input_size - (split_size + 1);
              iVar6 = 0;
            }
LAB_01b39486:
          } while (iVar6 == 0);
          if (iVar6 == 3) {
LAB_01b39497:
            if (input_size != 0) {
              SplitInput::AddSplit((SplitInput *)local_148,input_data_00,input_size,list_idx);
              list_idx = list_idx + 1;
            }
          }
          else {
            list_idx = 1;
          }
        }
        *(idx_t *)(local_d8 + uVar11 * 0x10 + 8) = list_idx;
        *(idx_t *)(local_d8 + uVar11 * 0x10) = size;
        size = size + list_idx;
        args = local_e8;
        result = local_e0;
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_120._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_148,(unsigned_long *)&local_120);
          peVar3 = (element_type *)CONCAT44(local_148._4_4_,local_148._0_4_);
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_148._12_4_,local_148._8_4_);
          local_148._0_4_ = 0;
          local_148._4_4_ = 0;
          local_148._8_4_ = 0;
          local_148._12_4_ = 0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_148._12_4_,local_148._8_4_) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_148._12_4_,local_148._8_4_));
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_f0);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar2 = (byte)uVar11 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar11 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < args->count);
  }
  ListVector::SetListSize(result,size);
  bVar5 = DataChunk::AllConstant(args);
  if (bVar5) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  if ((SelectionVector *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ParsePathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1 || args.ColumnCount() == 2);
	UnifiedVectorFormat input_data;
	args.data[0].ToUnifiedFormat(args.size(), input_data);
	auto inputs = UnifiedVectorFormat::GetData<string_t>(input_data);

	// set the separator
	string input_sep = "default";
	if (args.ColumnCount() == 2) {
		UnifiedVectorFormat sep_data;
		args.data[1].ToUnifiedFormat(args.size(), sep_data);
		if (sep_data.validity.RowIsValid(0)) {
			input_sep = UnifiedVectorFormat::GetData<string_t>(sep_data)->GetString();
		}
	}
	const string sep = GetSeparator(input_sep);

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::FLAT_VECTOR);
	ListVector::SetListSize(result, 0);

	// set up the list entries
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &child_entry = ListVector::GetEntry(result);
	auto &result_mask = FlatVector::Validity(result);
	idx_t total_splits = 0;
	for (idx_t i = 0; i < args.size(); i++) {
		auto input_idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(input_idx)) {
			result_mask.SetInvalid(i);
			continue;
		}
		SplitInput split_input(result, child_entry, total_splits);
		auto list_length = SplitPath(inputs[input_idx], sep, split_input);
		list_data[i].length = list_length;
		list_data[i].offset = total_splits;
		total_splits += list_length;
	}
	ListVector::SetListSize(result, total_splits);
	D_ASSERT(ListVector::GetListSize(result) == total_splits);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}